

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O1

_Bool simulate(Windows *gameInterface,UnitList *guardList,UnitList *inmateList,Path *path)

{
  int iVar1;
  Inmate *inmate;
  UnitNode *pUVar2;
  WINDOW *pWVar3;
  long lVar4;
  __syscall_slong_t _Var5;
  UnitNode *pUVar6;
  ulong uVar7;
  long lVar8;
  undefined8 uStack_60;
  int aiStack_58 [2];
  undefined1 local_50 [8];
  timespec delay;
  float local_34;
  
  lVar4 = -((ulong)(uint)inmateList->count * 4 + 0xf & 0xfffffffffffffff0);
  local_50 = (undefined1  [8])0x0;
  delay.tv_sec = 50000000;
  local_34 = 0.0;
  delay.tv_nsec = (__syscall_slong_t)path;
  do {
    if (inmateList == (UnitList *)0x0) {
      pUVar6 = (UnitNode *)0x0;
    }
    else {
      pUVar6 = inmateList->head;
    }
    iVar1 = inmateList->count;
    if (0 < (long)iVar1) {
      lVar8 = 0;
      do {
        *(int *)((long)aiStack_58 + lVar8 * 4 + lVar4 + -0x58 + 0x58) =
             (int)*(float *)((long)pUVar6->unit + 4);
        pUVar6 = pUVar6->next;
        lVar8 = lVar8 + 1;
      } while (iVar1 != lVar8);
    }
    _Var5 = delay.tv_nsec;
    *(undefined8 *)((long)&uStack_60 + lVar4) = 0x1045a7;
    inmateMove(inmateList,(Path *)_Var5);
    if (inmateList == (UnitList *)0x0) {
      pUVar6 = (UnitNode *)0x0;
    }
    else {
      pUVar6 = inmateList->head;
    }
    uVar7 = (ulong)(uint)inmateList->count;
    if (0 < inmateList->count) {
      lVar8 = 0;
      do {
        _Var5 = delay.tv_nsec;
        inmate = (Inmate *)pUVar6->unit;
        if (inmate->delUnit == false) {
          pWVar3 = gameInterface->body;
          iVar1 = *(int *)((long)aiStack_58 + lVar8 * 4 + lVar4 + -0x58 + 0x58);
          *(undefined8 *)((long)&uStack_60 + lVar4) = 0x104606;
          redrawUnit(pWVar3,inmate,(Path *)_Var5,(float)iVar1);
        }
        else {
          if ((int)uVar7 != 0) {
            pUVar2 = inmateList->tail->prev;
            inmateList->count = (int)uVar7 + -1;
            inmateList->tail = pUVar2;
          }
          if (inmateList->head != (UnitNode *)0x0) {
            inmateList->head->prev = (UnitNode *)0x0;
          }
        }
        pUVar6 = pUVar6->next;
        lVar8 = lVar8 + 1;
        uVar7 = (ulong)inmateList->count;
      } while (lVar8 < (long)uVar7);
    }
    local_34 = local_34 + 0.25;
    pWVar3 = gameInterface->body;
    *(undefined8 *)((long)&uStack_60 + lVar4) = 0x104632;
    wrefresh(pWVar3);
    *(undefined8 *)((long)&uStack_60 + lVar4) = 0x10463d;
    nanosleep((timespec *)local_50,(timespec *)0x0);
  } while (local_34 < 40.0);
  return true;
}

Assistant:

bool simulate(struct Windows *gameInterface,
    struct UnitList *guardList, struct UnitList *inmateList,
    struct Path *path) {

    struct UnitNode *nextInmate;
    float simulateTime = 0;
    int prevPos[inmateList->count];
    struct timespec delay;

    delay.tv_sec = 0;
    delay.tv_nsec = 50000000L;  // Half second in nano seconds

    while (simulateTime < 40) {

        nextInmate = getHead(inmateList);
        for (int i = 0; i < inmateList->count; i++) {
            prevPos[i] = ((struct Inmate *) nextInmate->unit)->position;
            nextInmate = nextInmate->next;
        }

        inmateMove(inmateList, path);
        //guardAttack(guardList, inmateList);
        nextInmate = getHead(inmateList);

        for (int i = 0; i < inmateList->count; i++) {
            if (((struct Inmate *) nextInmate->unit)->delUnit == FALSE)
                redrawUnit(gameInterface->body,
                    (struct Inmate *) nextInmate->unit, path, prevPos[i]);
            else {
                /*Call redraw but delete it?, or simply call eraseUnit in UI*/
                dequeue(inmateList);
            }
            nextInmate = nextInmate->next;
        }
        simulateTime += .25;
        wrefresh(gameInterface->body);
        nanosleep(&delay, NULL);
    }

    return true;  //TODO return win condition

}